

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

CappedArray<char,_3UL> kj::hex(uchar i)

{
  long lVar1;
  byte *pbVar2;
  byte bVar3;
  undefined7 in_register_00000039;
  ulong uVar4;
  CappedArray<char,_3UL> CVar5;
  uint8_t reverse [2];
  CappedArray<char,_3UL> result;
  
  uVar4 = CONCAT71(in_register_00000039,i);
  result.currentSize = 3;
  if ((int)uVar4 == 0) {
    pbVar2 = reverse + 1;
    reverse[0] = '\0';
  }
  else {
    pbVar2 = reverse;
    while (bVar3 = (byte)uVar4, bVar3 != 0) {
      *pbVar2 = bVar3 & 0xf;
      pbVar2 = pbVar2 + 1;
      uVar4 = (ulong)(bVar3 >> 4);
    }
  }
  lVar1 = 0;
  for (; reverse < pbVar2; pbVar2 = pbVar2 + -1) {
    result.content[lVar1] = "0123456789abcdef"[pbVar2[-1]];
    lVar1 = lVar1 + 1;
  }
  CVar5._8_4_ = result._8_4_ & 0xffffff;
  CVar5.currentSize = lVar1;
  CVar5._12_4_ = 0;
  return CVar5;
}

Assistant:

CappedArray(): currentSize(fixedSize) {}